

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true>::FreezeInternal
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true> *this,
          DynamicObject *instance,bool isConvertedType)

{
  JavascriptLibrary *pJVar1;
  bool bVar2;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *pSVar3;
  uint index;
  uint uVar4;
  BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
  *this_00;
  ushort uVar5;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *local_30;
  
  DynamicTypeHandler::ChangeFlags(&this->super_DynamicTypeHandler,0xc1,0xc0);
  this_00 = (this->propertyMap).ptr;
  if (0 < this_00->count - this_00->freeCount) {
    index = 0;
    uVar5 = 1;
    do {
      pSVar3 = JsUtil::
               BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
               ::GetReferenceAt(this_00,index);
      if ((pSVar3->Attributes & 0x10) == 0) {
        pSVar3->Attributes = pSVar3->Attributes & 0xe9;
      }
      index = (uint)uVar5;
      this_00 = (this->propertyMap).ptr;
      uVar4 = (uint)uVar5;
      uVar5 = uVar5 + 1;
    } while ((int)uVar4 < this_00->count - this_00->freeCount);
  }
  if (!isConvertedType) {
    DynamicObject::ChangeType(instance);
  }
  bVar2 = DynamicObject::HasObjectArray(instance);
  if (*(long **)&(instance->field_1).field_1 != (long *)0x0 && bVar2) {
    (**(code **)(**(long **)&(instance->field_1).field_1 + 0x1c0))();
  }
  DynamicTypeHandler::SetHasOnlyWritableDataProperties(&this->super_DynamicTypeHandler,false);
  if (((this->super_DynamicTypeHandler).flags & 0x20) != 0) {
    DynamicTypeHandler::InvalidateStoreFieldCachesForAllProperties
              (&this->super_DynamicTypeHandler,
               (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
               super_JavascriptLibraryBase).scriptContext.ptr);
    pJVar1 = (((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
    Memory::Recycler::WBSetBit((char *)&local_30);
    local_30 = &pJVar1->typesWithOnlyWritablePropertyProtoChain;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_30);
    PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear(local_30);
  }
  return 1;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::FreezeInternal(DynamicObject* instance, bool isConvertedType)
    {
        AssertMsg(IsNotExtensibleSupported, "This method must not be called for SimpleDictionaryTypeHandler<TPropertyIndex, IsNotExtensibleSupported = false>");

        this->ChangeFlags(IsExtensibleFlag | IsSealedOnceFlag | IsFrozenOnceFlag,
            0 | IsSealedOnceFlag | IsFrozenOnceFlag);

        //Set [[Writable]] flag of each property to false except for setter\getters
        //Set [[Configurable]] flag of each property to false
        SimpleDictionaryPropertyDescriptor<TPropertyIndex> *descriptor = nullptr;
        for (TPropertyIndex index = 0; index < propertyMap->Count(); index++)
        {
            descriptor = propertyMap->GetReferenceAt(index);
            if (!(descriptor->Attributes & PropertyLetConstGlobal))
            {
                descriptor->Attributes &= ~(PropertyWritable | PropertyConfigurable);
            }
        }

        if (!isConvertedType)
        {
            // Change of [[Writable]] property requires cache invalidation, hence ChangeType
            instance->ChangeType();
        }

        ArrayObject * objectArray = instance->GetObjectArray();
        if (objectArray)
        {
            objectArray->Freeze();
        }

        this->ClearHasOnlyWritableDataProperties();
        if (GetFlags() & IsPrototypeFlag)
        {
            InvalidateStoreFieldCachesForAllProperties(instance->GetScriptContext());
            instance->GetLibrary()->GetTypesWithOnlyWritablePropertyProtoChainCache()->Clear();
        }

        return TRUE;
    }